

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O0

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::UniqueNameGenerator
          (UniqueNameGenerator *this,char *template_name)

{
  allocator<char> local_2d [20];
  allocator<char> local_19;
  char *local_18;
  char *template_name_local;
  UniqueNameGenerator *this_local;
  
  local_18 = template_name;
  template_name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,template_name,&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->separator_,"_",local_2d);
  std::allocator<char>::~allocator(local_2d);
  return;
}

Assistant:

UniqueNameGenerator::UniqueNameGenerator(const char *template_name) :
    template_name_(template_name),
    separator_("_") {
}